

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring64_bitmap_t * roaring64_bitmap_andnot(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  int iVar1;
  art_ref_t aVar2;
  roaring64_bitmap_t *r;
  ulong uVar3;
  container_t *container;
  leaf_t lVar4;
  int *container_00;
  uint uVar5;
  int *piVar6;
  uint uVar7;
  long lVar8;
  uint8_t uVar9;
  uint uVar10;
  undefined8 *c;
  art_iterator_t *paVar11;
  uint8_t result_typecode;
  art_iterator_t it1;
  art_iterator_t it2;
  uint8_t local_151;
  art_iterator_t local_150;
  art_iterator_t local_c0;
  
  r = (roaring64_bitmap_t *)(*global_memory_hook.malloc)(0xb8);
  (r->art).root = 0;
  (r->art).first_free[0] = 0;
  (r->art).first_free[1] = 0;
  (r->art).first_free[2] = 0;
  (r->art).first_free[3] = 0;
  (r->art).first_free[4] = 0;
  (r->art).first_free[5] = 0;
  (r->art).capacities[0] = 0;
  (r->art).capacities[1] = 0;
  (r->art).capacities[2] = 0;
  (r->art).capacities[3] = 0;
  (r->art).capacities[4] = 0;
  (r->art).capacities[5] = 0;
  (r->art).nodes[1] = (art_node_t *)0x0;
  (r->art).nodes[2] = (art_node_t *)0x0;
  (r->art).nodes[3] = (art_node_t *)0x0;
  (r->art).nodes[4] = (art_node_t *)0x0;
  *(undefined8 *)((long)(r->art).nodes + 0x21) = 0;
  *(undefined8 *)((long)(r->art).nodes + 0x29) = 0;
  r->first_free = 0;
  r->capacity = 0;
  r->containers = (container_t **)0x0;
  memset(&local_150,0,0x90);
  aVar2 = (r1->art).root;
  local_150.art = &r1->art;
  if (aVar2 != 0) {
    art_node_init_iterator(aVar2,&local_150,true);
  }
  memset(&local_c0,0,0x90);
  aVar2 = (r2->art).root;
  local_c0.art = &r2->art;
  if (aVar2 != 0) {
    art_node_init_iterator(aVar2,&local_c0,true);
  }
  if (local_150.value != (ulong *)0x0) {
    do {
      if (local_c0.value == (ulong *)0x0) {
LAB_001288de:
        uVar3 = *local_150.value;
        c = (undefined8 *)r1->containers[uVar3 >> 8];
        if ((char)uVar3 == '\x04') {
          uVar3 = (ulong)*(byte *)(c + 1);
          c = (undefined8 *)*c;
        }
        container = container_clone(c,(uint8_t)uVar3);
        lVar4 = add_container(r,container,(uint8_t)uVar3);
        art_insert((art_t *)r,local_150.key,lVar4);
        paVar11 = &local_150;
      }
      else {
        uVar5 = (uint)local_150.key._0_4_ >> 0x18 | (local_150.key._0_4_ & 0xff0000) >> 8 |
                (local_150.key._0_4_ & 0xff00) << 8 | local_150.key._0_4_ << 0x18;
        uVar7 = (uint)local_c0.key._0_4_ >> 0x18 | (local_c0.key._0_4_ & 0xff0000) >> 8 |
                (local_c0.key._0_4_ & 0xff00) << 8 | local_c0.key._0_4_ << 0x18;
        if (uVar5 == uVar7) {
          uVar5 = (uint)(ushort)(local_150.key._4_2_ << 8 | (ushort)local_150.key._4_2_ >> 8);
          uVar7 = (uint)(ushort)(local_c0.key._4_2_ << 8 | (ushort)local_c0.key._4_2_ >> 8);
          uVar10 = 0;
          if (uVar5 != uVar7) goto LAB_001288c8;
        }
        else {
LAB_001288c8:
          uVar10 = -(uint)(uVar5 < uVar7) | 1;
        }
        paVar11 = &local_c0;
        if (uVar10 == 0) {
          container_00 = (int *)container_andnot(r1->containers[*local_150.value >> 8],
                                                 (uint8_t)*local_150.value,
                                                 r2->containers[*local_c0.value >> 8],
                                                 (uint8_t)*local_c0.value,&local_151);
          piVar6 = container_00;
          uVar9 = local_151;
          if (local_151 == '\x04') {
            uVar9 = (uint8_t)container_00[2];
            piVar6 = *(int **)container_00;
          }
          iVar1 = *piVar6;
          if ((uVar9 == '\x03') || (uVar9 == '\x02')) {
            if (iVar1 < 1) goto LAB_001289b8;
LAB_001289c5:
            lVar4 = add_container(r,container_00,local_151);
            art_insert((art_t *)r,local_150.key,lVar4);
          }
          else {
            if (iVar1 != 0) {
              if (iVar1 != -1) goto LAB_001289c5;
              lVar8 = 0;
              do {
                if (*(long *)(*(long *)(piVar6 + 2) + lVar8 * 8) != 0) goto LAB_001289c5;
                lVar8 = lVar8 + 1;
              } while (lVar8 != 0x400);
            }
LAB_001289b8:
            container_free(container_00,local_151);
          }
          art_iterator_move(&local_150,true);
        }
        else if ((int)uVar10 < 0) goto LAB_001288de;
      }
      art_iterator_move(paVar11,true);
    } while (local_150.value != (ulong *)0x0);
  }
  return r;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_andnot(const roaring64_bitmap_t *r1,
                                            const roaring64_bitmap_t *r2) {
    roaring64_bitmap_t *result = roaring64_bitmap_create();

    art_iterator_t it1 = art_init_iterator((art_t *)&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator((art_t *)&r2->art, /*first=*/true);

    while (it1.value != NULL) {
        // Cases:
        // 1. it1_present && !it2_present -> output it1, it1++
        // 2. it1_present && it2_present
        //    a. it1 <  it2 -> output it1, it1++
        //    b. it1 == it2 -> output it1 - it2, it1++, it2++
        //    c. it1 >  it2 -> it2++
        bool it2_present = it2.value != NULL;
        int compare_result = 0;
        if (it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 2b: iterators at the same high key position.
                leaf_t *leaf1 = (leaf_t *)it1.value;
                leaf_t leaf2 = (leaf_t)*it2.value;
                uint8_t result_typecode;
                container_t *result_container = container_andnot(
                    get_container(r1, *leaf1), get_typecode(*leaf1),
                    get_container(r2, leaf2), get_typecode(leaf2),
                    &result_typecode);

                if (container_nonzero_cardinality(result_container,
                                                  result_typecode)) {
                    leaf_t result_leaf = add_container(result, result_container,
                                                       result_typecode);
                    art_insert(&result->art, it1.key, (art_val_t)result_leaf);
                } else {
                    container_free(result_container, result_typecode);
                }
                art_iterator_next(&it1);
                art_iterator_next(&it2);
            }
        }
        if (!it2_present || compare_result < 0) {
            // Cases 1 and 2a: it1 is the only iterator or is before it2.
            leaf_t result_leaf =
                copy_leaf_container(r1, result, (leaf_t)*it1.value);
            art_insert(&result->art, it1.key, (art_val_t)result_leaf);
            art_iterator_next(&it1);
        } else if (compare_result > 0) {
            // Case 2c: it1 is after it2.
            art_iterator_next(&it2);
        }
    }
    return result;
}